

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

bool __thiscall
GraphPropagator::coherence_outedges
          (GraphPropagator *this,int node,vector<int,_std::allocator<int>_> *remvd_e)

{
  Reason r_00;
  bool bVar1;
  int iVar2;
  Lit LVar3;
  Lit LVar4;
  ulong uVar5;
  reference pvVar6;
  size_type sVar7;
  uint *puVar8;
  BoolView *pBVar9;
  Clause *elem;
  vec<Lit> *this_00;
  Lit *pLVar10;
  uint in_ESI;
  long in_RDI;
  Clause *r;
  Clause *expl;
  vec<Lit> ps;
  edge_id edge;
  uint i;
  BoolView *in_stack_ffffffffffffff48;
  BoolView *in_stack_ffffffffffffff50;
  BoolView *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined1 learnt;
  undefined4 in_stack_ffffffffffffff70;
  Reason local_70;
  int local_64;
  Clause *local_60;
  Clause *local_58;
  int local_50;
  int local_3c;
  vec<Lit> local_38;
  uint local_28;
  uint local_24;
  uint local_14;
  
  local_24 = 0;
  local_14 = in_ESI;
  do {
    uVar5 = (ulong)local_24;
    pvVar6 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)(in_RDI + 0x68),(long)(int)local_14);
    sVar7 = std::vector<int,_std::allocator<int>_>::size(pvVar6);
    if (sVar7 <= uVar5) {
      return true;
    }
    pvVar6 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)(in_RDI + 0x68),(long)(int)local_14);
    puVar8 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](pvVar6,(ulong)local_24);
    local_28 = *puVar8;
    vec<BoolView>::operator[]((vec<BoolView> *)(in_RDI + 0x28),local_28);
    bVar1 = BoolView::isFixed((BoolView *)0x2a908e);
    if (bVar1) {
      vec<BoolView>::operator[]((vec<BoolView> *)(in_RDI + 0x28),local_28);
      iVar2 = BoolView::getVal(in_stack_ffffffffffffff50);
      if (iVar2 == 1) {
        if ((so.lazy & 1U) != 0) {
          vec<Lit>::vec(&local_38);
          vec<BoolView>::operator[]((vec<BoolView> *)(in_RDI + 0x28),local_28);
          LVar3 = BoolView::getValLit(in_stack_ffffffffffffff48);
          local_3c = LVar3.x;
          vec<Lit>::push((vec<Lit> *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                         (Lit *)in_stack_ffffffffffffff58);
          pBVar9 = vec<BoolView>::operator[]((vec<BoolView> *)(in_RDI + 0x18),local_14);
          learnt = (undefined1)((ulong)pBVar9 >> 0x38);
          LVar4 = BoolView::getValLit(in_stack_ffffffffffffff48);
          local_50 = LVar4.x;
          vec<Lit>::push((vec<Lit> *)CONCAT44(LVar4.x,in_stack_ffffffffffffff60),
                         (Lit *)in_stack_ffffffffffffff58);
          elem = ::Clause_new<vec<Lit>>
                           ((vec<Lit> *)CONCAT44(LVar3.x,in_stack_ffffffffffffff70),(bool)learnt);
          *(uint *)elem = *(uint *)elem | 2;
          local_58 = elem;
          this_00 = (vec<Lit> *)vec<vec<Clause_*>_>::last(&sat.rtrail);
          vec<Clause_*>::push((vec<Clause_*> *)CONCAT44(LVar4.x,in_stack_ffffffffffffff60),
                              (Clause **)elem);
          sat.confl = local_58;
          vec<Lit>::~vec(this_00);
        }
        return false;
      }
    }
    vec<BoolView>::operator[]((vec<BoolView> *)(in_RDI + 0x28),local_28);
    bVar1 = BoolView::isFixed((BoolView *)0x2a922e);
    if (!bVar1) {
      local_60 = (Clause *)0x0;
      if ((so.lazy & 1U) != 0) {
        local_60 = ::Reason_new((int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
        vec<BoolView>::operator[]((vec<BoolView> *)(in_RDI + 0x18),local_14);
        local_64 = (int)BoolView::getValLit(in_stack_ffffffffffffff48);
        pLVar10 = Clause::operator[]((Clause *)in_stack_ffffffffffffff50,
                                     (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
        pLVar10->x = local_64;
      }
      in_stack_ffffffffffffff48 =
           vec<BoolView>::operator[]((vec<BoolView> *)(in_RDI + 0x28),local_28);
      Reason::Reason(&local_70,local_60);
      r_00.field_0._a._4_4_ = in_stack_ffffffffffffff64;
      r_00.field_0._a._0_4_ = in_stack_ffffffffffffff60;
      BoolView::setVal2(in_stack_ffffffffffffff58,SUB81((ulong)in_stack_ffffffffffffff50 >> 0x38,0),
                        r_00);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 (value_type_conflict *)in_stack_ffffffffffffff58);
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

bool GraphPropagator::coherence_outedges(int node, std::vector<edge_id>& remvd_e) {
	for (unsigned int i = 0; i < adj[node].size(); i++) {
		const edge_id edge = adj[node][i];
		// Edge with missing an endnode
		if (es[edge].isFixed() && es[edge].getVal() == 1) {
			if (so.lazy) {
				vec<Lit> ps;
				ps.push(es[edge].getValLit());
				ps.push(vs[node].getValLit());
				Clause* expl = Clause_new(ps);
				expl->temp_expl = 1;
				sat.rtrail.last().push(expl);
				sat.confl = expl;
			}
			return false;
		}
		// Edge that must be removed
		if (!es[edge].isFixed()) {
			Clause* r = nullptr;
			if (so.lazy) {
				r = Reason_new(2);
				(*r)[1] = vs[node].getValLit();
			}
			if (GRAPHPROP_DEBUG) {
				std::cout << "COHERENCE (E) " << edge << '\n';
			}
			es[edge].setVal2(false, r);
			remvd_e.push_back(edge);
		}
	}
	return true;
}